

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O0

string * Kernel::inputTypeName_abi_cxx11_(UnitInputType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte in_SIL;
  string *in_RDI;
  string *psVar1;
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [19];
  allocator<char> local_a [10];
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_SIL;
  psVar1 = in_RDI;
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_a);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_1d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_20);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_21);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_22);
  }
  return psVar1;
}

Assistant:

std::string Kernel::inputTypeName(UnitInputType type)
{
  switch (type) {
    case UnitInputType::AXIOM:
      return "axiom";
    case UnitInputType::ASSUMPTION:
      return "assumption";
    case UnitInputType::CONJECTURE:
      return "conjecture";
    case UnitInputType::NEGATED_CONJECTURE:
      return "negated conjecture";
    case UnitInputType::CLAIM:
      return "claim";
    case UnitInputType::EXTENSIONALITY_AXIOM:
      return "extensionality axiom";
  default:
      return "unknown";
  }
}